

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O0

disp_binder_unique_ptr_t __thiscall
so_5::disp::active_group::impl::real_private_dispatcher_t::binder
          (real_private_dispatcher_t *this,string *group_name)

{
  type args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  intrusive_ptr_t<so_5::disp::active_group::private_dispatcher_t> local_30;
  unique_ptr<so_5::disp::reuse::binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::active_group::private_dispatcher_t>,_so_5::disp::active_group::impl::proxy_dispatcher_t,_so_5::disp::active_group::impl::binding_actions_t>,_std::default_delete<so_5::disp::reuse::binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::active_group::private_dispatcher_t>,_so_5::disp::active_group::impl::proxy_dispatcher_t,_so_5::disp::active_group::impl::binding_actions_t>_>_>
  local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *group_name_local;
  real_private_dispatcher_t *this_local;
  
  local_20 = in_RDX;
  group_name_local = group_name;
  this_local = this;
  intrusive_ptr_t<so_5::disp::active_group::private_dispatcher_t>::intrusive_ptr_t
            (&local_30,(private_dispatcher_t *)group_name);
  args_1 = std::
           unique_ptr<so_5::disp::active_group::impl::proxy_dispatcher_t,_std::default_delete<so_5::disp::active_group::impl::proxy_dispatcher_t>_>
           ::operator*((unique_ptr<so_5::disp::active_group::impl::proxy_dispatcher_t,_std::default_delete<so_5::disp::active_group::impl::proxy_dispatcher_t>_>
                        *)(group_name + 0x10));
  stdcpp::
  make_unique<so_5::disp::reuse::binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::active_group::private_dispatcher_t>,so_5::disp::active_group::impl::proxy_dispatcher_t,so_5::disp::active_group::impl::binding_actions_t>,so_5::intrusive_ptr_t<so_5::disp::active_group::private_dispatcher_t>,so_5::disp::active_group::impl::proxy_dispatcher_t&,std::__cxx11::string_const&>
            ((stdcpp *)&local_28,&local_30,args_1,local_20);
  std::unique_ptr<so_5::disp_binder_t,std::default_delete<so_5::disp_binder_t>>::
  unique_ptr<so_5::disp::reuse::binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::active_group::private_dispatcher_t>,so_5::disp::active_group::impl::proxy_dispatcher_t,so_5::disp::active_group::impl::binding_actions_t>,std::default_delete<so_5::disp::reuse::binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::active_group::private_dispatcher_t>,so_5::disp::active_group::impl::proxy_dispatcher_t,so_5::disp::active_group::impl::binding_actions_t>>,void>
            ((unique_ptr<so_5::disp_binder_t,std::default_delete<so_5::disp_binder_t>> *)this,
             &local_28);
  std::
  unique_ptr<so_5::disp::reuse::binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::active_group::private_dispatcher_t>,_so_5::disp::active_group::impl::proxy_dispatcher_t,_so_5::disp::active_group::impl::binding_actions_t>,_std::default_delete<so_5::disp::reuse::binder_for_private_disp_template_t<so_5::intrusive_ptr_t<so_5::disp::active_group::private_dispatcher_t>,_so_5::disp::active_group::impl::proxy_dispatcher_t,_so_5::disp::active_group::impl::binding_actions_t>_>_>
  ::~unique_ptr(&local_28);
  intrusive_ptr_t<so_5::disp::active_group::private_dispatcher_t>::~intrusive_ptr_t(&local_30);
  return (__uniq_ptr_data<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>,_true,_true>
         )(__uniq_ptr_data<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>,_true,_true>
           )this;
}

Assistant:

virtual so_5::disp_binder_unique_ptr_t
		binder( const std::string & group_name ) override
			{
				return so_5::stdcpp::make_unique< private_dispatcher_binder_t >(
						private_dispatcher_handle_t( this ),
						*m_disp,
						group_name );
			}